

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool bVar1;
  TestResult *this_00;
  char *pcVar2;
  TestInfo *in_RSI;
  String *this_01;
  longlong *in_stack_ffffffffffffffb8;
  char local_40 [8];
  String *in_stack_ffffffffffffffc8;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  TestInfo::result(in_RSI);
  bVar1 = TestResult::Passed((TestResult *)0x206db9);
  this_00 = TestInfo::result(in_RSI);
  TestResult::elapsed_time(this_00);
  this_01 = (String *)&stack0xffffffffffffffb0;
  StreamableToString<long_long>(in_stack_ffffffffffffffb8);
  pcVar2 = String::c_str(this_01);
  String::Format(local_40,"event=TestEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,pcVar2);
  String::operator_cast_to_string(in_stack_ffffffffffffffc8);
  Send((StreamingListener *)in_RSI,in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_30);
  String::~String(this_01);
  String::~String(this_01);
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) {
    Send(String::Format(
        "event=TestEnd&passed=%d&elapsed_time=%sms\n",
        (test_info.result())->Passed(),
        StreamableToString((test_info.result())->elapsed_time()).c_str()));
  }